

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O1

void __thiscall
skiwi::anon_unknown_23::c_input_test_10doubles::~c_input_test_10doubles
          (c_input_test_10doubles *this)

{
  compile_fixture::~compile_fixture(&this->super_compile_fixture);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      std::stringstream str, str2;
      std::string script = R"(
(c-input "(double a, double b, double c, double d, double e, double f, double g, double h, double i, double j) " )

(+ a b c d e f g h i j)
)";
      bool error = false;
      asmcode code;
      try
        {
        code = get_asmcode(script);
        }
      catch (std::logic_error e)
        {
        error = true;
        str << e.what();
        }
      if (!error)
        {
        first_pass_data d;
        uint64_t size;
        fun_ptr f = (fun_ptr)assemble(size, d, code);
        if (f)
          {
          uint64_t res = f(&ctxt, 1.1, 2.2, 3.3, 4.4, 5.5, 6.6, 7.7, 8.8, 9.9, 10.0);
          scheme_runtime(res, str, env, rd, nullptr);

          uint64_t res2 = f(&ctxt, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 101.123, 4.5);
          scheme_runtime(res2, str2, env, rd, nullptr);

          compiled_functions.emplace_back(f, size);
          }
        }
      TEST_EQ("59.5", str.str());
      TEST_EQ("105.623", str2.str());
      }